

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O0

void __thiscall
Js::WebAssemblyModule::InitializeMemory(WebAssemblyModule *this,MemorySectionLimits *memoryLimits)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  WasmCompilationException *pWVar5;
  bool local_59;
  anon_class_4_1_c2c236e1 local_30;
  uint32 minBytes;
  anon_class_4_1_c2c236e1 minPageTooBig;
  uint32 maxPage;
  uint32 minPage;
  MemorySectionLimits *memoryLimits_local;
  WebAssemblyModule *this_local;
  
  if (memoryLimits == (MemorySectionLimits *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyModule.cpp"
                                ,0x13c,"((0))","UNREACHED");
    if (bVar2) {
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
      pWVar5 = (WasmCompilationException *)__cxa_allocate_exception(8);
      Wasm::WasmCompilationException::WasmCompilationException(pWVar5,L"Internal Error");
      __cxa_throw(pWVar5,&Wasm::WasmCompilationException::typeinfo,
                  Wasm::WasmCompilationException::~WasmCompilationException);
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if (((byte)this->field_0x20 >> 1 & 1) == 0) {
    local_30.minPage = (memoryLimits->super_SectionLimits).initial;
    minBytes = (memoryLimits->super_SectionLimits).maximum;
    minPageTooBig.minPage = local_30.minPage;
    if (local_30.minPage <= minBytes) {
      uVar3 = UInt32Math::
              Mul<65536u,Js::WebAssemblyModule::InitializeMemory(Wasm::MemorySectionLimits*)::__0>
                        (local_30.minPage,&local_30);
      if (0x7fffffff < uVar3) {
        InitializeMemory::anon_class_4_1_c2c236e1::operator()(&local_30);
      }
      bVar2 = Wasm::Threads::IsEnabled();
      local_59 = false;
      if (bVar2) {
        local_59 = Wasm::MemorySectionLimits::IsShared(memoryLimits);
      }
      this->field_0x20 = this->field_0x20 & 0xfb | local_59 << 2;
      this->field_0x20 = this->field_0x20 & 0xfd | 2;
      this->m_memoryInitSize = minPageTooBig.minPage;
      this->m_memoryMaxSize = minBytes;
      return;
    }
    pWVar5 = (WasmCompilationException *)__cxa_allocate_exception(8);
    Wasm::WasmCompilationException::WasmCompilationException
              (pWVar5,L"Memory: MaxPage (%u) must be greater than MinPage (%u)",(ulong)minBytes,
               (ulong)minPageTooBig.minPage);
    __cxa_throw(pWVar5,&Wasm::WasmCompilationException::typeinfo,
                Wasm::WasmCompilationException::~WasmCompilationException);
  }
  pWVar5 = (WasmCompilationException *)__cxa_allocate_exception(8);
  Wasm::WasmCompilationException::WasmCompilationException(pWVar5,L"Memory already allocated");
  __cxa_throw(pWVar5,&Wasm::WasmCompilationException::typeinfo,
              Wasm::WasmCompilationException::~WasmCompilationException);
}

Assistant:

void
WebAssemblyModule::InitializeMemory(_In_ Wasm::MemorySectionLimits* memoryLimits)
{
    if (!memoryLimits)
    {
        Assert(UNREACHED);
        throw Wasm::WasmCompilationException(_u("Internal Error"));
    }
    if (m_hasMemory)
    {
        throw Wasm::WasmCompilationException(_u("Memory already allocated"));
    }

    uint32 minPage = memoryLimits->initial;
    uint32 maxPage = memoryLimits->maximum;

    if (maxPage < minPage)
    {
        throw Wasm::WasmCompilationException(_u("Memory: MaxPage (%u) must be greater than MinPage (%u)"), maxPage, minPage);
    }
    auto minPageTooBig = [minPage] {
        throw Wasm::WasmCompilationException(_u("Memory: Unable to allocate minimum pages (%u)"), minPage);
    };
    uint32 minBytes = UInt32Math::Mul<WebAssembly::PageSize>(minPage, minPageTooBig);
    if (minBytes > ArrayBuffer::MaxArrayBufferLength)
    {
        minPageTooBig();
    }

    m_memoryIsShared = Wasm::Threads::IsEnabled() && memoryLimits->IsShared();
    m_hasMemory = true;
    m_memoryInitSize = minPage;
    m_memoryMaxSize = maxPage;
}